

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall
embree::CommandLineParser::parseCommandLine(CommandLineParser *this,int argc,char **argv)

{
  ParseStream *this_00;
  CommandLineStream *this_01;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  Ref<embree::Stream<int>_> local_a8;
  CommandLineParser *local_a0;
  Ref<embree::ParseStream> local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_a0 = this;
  this_00 = (ParseStream *)::operator_new(0x48);
  this_01 = (CommandLineStream *)::operator_new(0x80);
  std::__cxx11::string::string((string *)&local_90,"command line",&local_a9);
  CommandLineStream::CommandLineStream(this_01,argc,argv,&local_90);
  local_a8.ptr = (Stream<int> *)this_01;
  (*(this_01->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_01);
  std::__cxx11::string::string((string *)&local_50,"\n\t\r ",&local_aa);
  std::__cxx11::string::string((string *)&local_70,"",&local_ab);
  ParseStream::ParseStream(this_00,&local_a8,&local_50,&local_70,false);
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this_00);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if ((CommandLineStream *)local_a8.ptr != (CommandLineStream *)0x0) {
    (*(((Stream<int> *)&(local_a8.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_90);
  local_98.ptr = this_00;
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this_00);
  FileName::FileName((FileName *)&local_90);
  parseCommandLine(local_a0,&local_98,(FileName *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

void CommandLineParser::parseCommandLine(int argc, char** argv)
  {
    /* create stream for parsing */
    Ref<ParseStream> stream = new ParseStream(new CommandLineStream(argc, argv));
    
    /* parse command line */  
    parseCommandLine(stream, FileName());
  }